

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O3

char * ly_out_filepath(ly_out *out,char *filepath)

{
  FILE *__stream;
  FILE *pFVar1;
  char *pcVar2;
  int *piVar3;
  
  if (out == (ly_out *)0x0) {
    pcVar2 = "out";
  }
  else {
    if (out->type == LY_OUT_FILEPATH) {
      if (filepath == (char *)0x0) {
        return (out->method).fpath.filepath;
      }
      __stream = (FILE *)(out->method).f;
      pFVar1 = fopen(filepath,"wb");
      (out->method).f = (FILE *)pFVar1;
      if (pFVar1 != (FILE *)0x0) {
        fclose(__stream);
        free((out->method).clb.arg);
        pcVar2 = strdup(filepath);
        (out->method).fpath.filepath = pcVar2;
        return (char *)0x0;
      }
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Failed to open file \"%s\" (%s).",filepath,pcVar2);
      (out->method).f = (FILE *)__stream;
      return (char *)0xffffffffffffffff;
    }
    pcVar2 = "out->type == LY_OUT_FILEPATH";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"ly_out_filepath");
  return (char *)-(ulong)(filepath == (char *)0x0);
}

Assistant:

LIBYANG_API_DEF const char *
ly_out_filepath(struct ly_out *out, const char *filepath)
{
    FILE *f;

    LY_CHECK_ARG_RET(NULL, out, out->type == LY_OUT_FILEPATH, filepath ? NULL : ((void *)-1));

    if (!filepath) {
        return out->method.fpath.filepath;
    }

    /* replace filepath */
    f = out->method.fpath.f;
    out->method.fpath.f = fopen(filepath, "wb");
    if (!out->method.fpath.f) {
        LOGERR(NULL, LY_ESYS, "Failed to open file \"%s\" (%s).", filepath, strerror(errno));
        out->method.fpath.f = f;
        return (void *)-1;
    }
    fclose(f);
    free(out->method.fpath.filepath);
    out->method.fpath.filepath = strdup(filepath);

    return NULL;
}